

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall embree::FileStream::FileStream(FileStream *this,FileName *fileName)

{
  ifstream *this_00;
  pointer pcVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Stream<int>).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_002c6648;
  (this->super_Stream<int>).start = 0;
  (this->super_Stream<int>).past = 0;
  (this->super_Stream<int>).future = 0;
  std::
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ::vector(&(this->super_Stream<int>).buffer,0x400,(allocator_type *)&local_70);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__FileStream_002c6688;
  this_00 = &this->ifs;
  std::ifstream::ifstream(this_00);
  this->lineNumber = 1;
  this->colNumber = 0;
  this->charNumber = 0;
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__p,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  (this->name).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&(this->name).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  if (((&this->field_0x60)[*(long *)(*(long *)this_00 + -0x18)] & 5) == 0) {
    std::ifstream::close();
  }
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  std::ifstream::open((string *)this_00,(_Ios_Openmode)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  std::operator+(&local_70,"cannot open file ",&local_50);
  std::runtime_error::runtime_error(this_01,(string *)&local_70);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileStream (const FileName& fileName)
      : lineNumber(1), colNumber(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(fileName.str())))
    {
      if (ifs) ifs.close();
      ifs.open(fileName.str());
      if (!ifs.is_open()) THROW_RUNTIME_ERROR("cannot open file " + fileName.str());
    }